

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

HRESULT __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::SysAllocErrorLine
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,int32 ichMinLine,BSTR *pbstrLine)

{
  EncodedCharPtr puVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  charcount_t cVar5;
  undefined4 *puVar6;
  size_t sVar7;
  BSTR buffer;
  DecodeOptions options;
  LPCUTF8 pbEnd;
  HRESULT HVar8;
  LPCUTF8 local_48;
  size_t local_40;
  size_t cb;
  
  if (pbstrLine == (BSTR *)0x0) {
    HVar8 = -0x7fffbffd;
  }
  else {
    HVar8 = -0x7fff0001;
    if ((-1 < ichMinLine) &&
       ((ulong)(uint)ichMinLine <= (ulong)((long)this->m_pchLast - (long)this->m_pchBase))) {
      cVar4 = IchMinLine(this);
      if (cVar4 == ichMinLine) {
        cb = (size_t)this->m_pchMinLine;
      }
      else {
        puVar1 = this->m_pchBase;
        sVar7 = UTF8EncodingPolicyBase<false>::CharacterOffsetToUnitOffset
                          (&this->super_UTF8EncodingPolicyBase<false>,puVar1,
                           this->m_currentCharacter,this->m_pchLast,ichMinLine);
        cb = (size_t)(puVar1 + sVar7);
      }
      local_40 = 0;
      cVar4 = LineLength(this,(EncodedCharPtr)cb,this->m_pchLast,&local_40);
      if ((int)cVar4 < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                           ,0x937,"(cch <= 2147483647L)","cch <= LONG_MAX");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      cVar5 = IchMinLine(this);
      if (cVar5 == ichMinLine) {
        pbEnd = this->m_pchMinLine + local_40;
      }
      else {
        puVar1 = this->m_pchBase;
        sVar7 = UTF8EncodingPolicyBase<false>::CharacterOffsetToUnitOffset
                          (&this->super_UTF8EncodingPolicyBase<false>,puVar1,
                           this->m_currentCharacter,this->m_pchLast,cVar4);
        pbEnd = puVar1 + sVar7;
      }
      HVar8 = 0;
      buffer = SysAllocStringLen((OLECHAR *)0x0,cVar4);
      *pbstrLine = buffer;
      if (buffer == (BSTR)0x0) {
        HVar8 = -0x7ff8fff2;
      }
      else {
        local_48 = (LPCUTF8)cb;
        options = (this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions &
                  ~doSecondSurrogatePair;
        (this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions = options;
        utf8::DecodeUnitsInto(buffer,&local_48,pbEnd,options,(bool *)0x0);
      }
    }
  }
  return HVar8;
}

Assistant:

HRESULT Scanner<EncodingPolicy>::SysAllocErrorLine(int32 ichMinLine, __out BSTR* pbstrLine)
{
    if( !pbstrLine )
    {
        return E_POINTER;
    }

    // If we overflow the string, we have a serious problem...
    if (ichMinLine < 0 || static_cast<size_t>(ichMinLine) > AdjustedLength() )
    {
        return E_UNEXPECTED;
    }

    typename EncodingPolicy::EncodedCharPtr pStart = static_cast<size_t>(ichMinLine) == IchMinLine() ? m_pchMinLine : m_pchBase + this->CharacterOffsetToUnitOffset(m_pchBase, m_currentCharacter, m_pchLast, ichMinLine);

    // Determine the length by scanning for the next newline
    size_t cb = 0;
    charcount_t cch = LineLength(pStart, m_pchLast, &cb);
    Assert(cch <= LONG_MAX);

    typename EncodingPolicy::EncodedCharPtr pEnd = static_cast<size_t>(ichMinLine) == IchMinLine() ? m_pchMinLine + cb : m_pchBase + this->CharacterOffsetToUnitOffset(m_pchBase, m_currentCharacter, m_pchLast, cch);

    *pbstrLine = SysAllocStringLen(NULL, cch);
    if (!*pbstrLine)
    {
        return E_OUTOFMEMORY;
    }

    this->ConvertToUnicode(*pbstrLine, cch, pStart, pEnd);
    return S_OK;
}